

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O0

void lydxml_log_namespace_err
               (lyxml_ctx *xmlctx,char *prefix,size_t prefix_len,char *attr_name,size_t attr_len)

{
  size_t attr_len_local;
  char *attr_name_local;
  size_t prefix_len_local;
  char *prefix_local;
  lyxml_ctx *xmlctx_local;
  
  if ((prefix_len == 0) || (attr_len == 0)) {
    if (prefix_len == 0) {
      ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_REFERENCE,"Missing XML namespace.");
    }
    else {
      ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_REFERENCE,"Unknown XML prefix \"%.*s\".",
              prefix_len & 0xffffffff,prefix);
    }
  }
  else {
    ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_REFERENCE,
            "Unknown XML prefix \"%.*s\" at attribute \"%.*s\".",prefix_len & 0xffffffff,prefix,
            (int)attr_len,attr_name);
  }
  return;
}

Assistant:

static void
lydxml_log_namespace_err(struct lyxml_ctx *xmlctx, const char *prefix, size_t prefix_len,
        const char *attr_name, size_t attr_len)
{
    if (prefix_len && attr_len) {
        LOGVAL(xmlctx->ctx, LYVE_REFERENCE, "Unknown XML prefix \"%.*s\" at attribute \"%.*s\".",
                (int)prefix_len, prefix, (int)attr_len, attr_name);
    } else if (prefix_len) {
        LOGVAL(xmlctx->ctx, LYVE_REFERENCE, "Unknown XML prefix \"%.*s\".",
                (int)prefix_len, prefix);
    } else {
        LOGVAL(xmlctx->ctx, LYVE_REFERENCE, "Missing XML namespace.");
    }
}